

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_paint(Terminal *term,wchar_t left,wchar_t top,wchar_t right,wchar_t bottom,
               _Bool immediately)

{
  wchar_t wVar1;
  wchar_t wVar2;
  termline **pptVar3;
  termline *ptVar4;
  ulong uVar5;
  int iVar6;
  uint *puVar7;
  wchar_t wVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t wVar11;
  ulong uVar12;
  
  uVar10 = 0;
  if (top < L'\x01') {
    top = L'\0';
  }
  wVar1 = term->rows;
  wVar8 = wVar1 + L'\xffffffff';
  if (bottom < wVar1) {
    wVar8 = bottom;
  }
  if (top < wVar1 && top <= wVar8) {
    wVar2 = term->cols;
    uVar12 = (ulong)(uint)(wVar2 + L'\xffffffff');
    if (right < wVar2) {
      uVar12 = (ulong)(uint)right;
    }
    if (L'\0' < left) {
      uVar10 = (ulong)(uint)left;
    }
    pptVar3 = term->disptext;
    uVar5 = uVar10 >> 1;
    wVar11 = (wchar_t)uVar12;
    iVar6 = (int)(uVar12 >> 0x1f) + wVar11 >> 1;
    uVar12 = (ulong)(uint)top;
    do {
      ptVar4 = pptVar3[uVar12];
      if ((ptVar4->lattr & 3) == 0) {
        if ((wchar_t)uVar10 < wVar2 && (wchar_t)uVar10 <= wVar11) {
          puVar7 = (uint *)((long)&ptVar4->chars->chr + (uVar10 << 5 | 8));
          uVar9 = uVar10;
          do {
            *puVar7 = *puVar7 | 0x3ffff;
            if ((long)wVar11 <= (long)uVar9) break;
            uVar9 = uVar9 + 1;
            puVar7 = puVar7 + 8;
          } while ((long)uVar9 < (long)wVar2);
        }
      }
      else if ((wchar_t)uVar5 < wVar2 && (wchar_t)uVar5 <= iVar6 + L'\x01') {
        puVar7 = (uint *)((long)&ptVar4->chars->chr + (uVar5 << 5 | 8));
        uVar9 = uVar5;
        do {
          *puVar7 = *puVar7 | 0x3ffff;
          if ((long)iVar6 < (long)uVar9) break;
          uVar9 = uVar9 + 1;
          puVar7 = puVar7 + 8;
        } while ((long)uVar9 < (long)wVar2);
      }
    } while (((long)uVar12 < (long)wVar8) && (uVar12 = uVar12 + 1, (long)uVar12 < (long)wVar1));
  }
  if (immediately) {
    do_paint(term);
    return;
  }
  if (term->window_update_pending == false) {
    term->window_update_pending = true;
    queue_toplevel_callback(term_update_callback,term);
    return;
  }
  return;
}

Assistant:

void term_paint(Terminal *term,
                int left, int top, int right, int bottom, bool immediately)
{
    int i, j;
    if (left < 0) left = 0;
    if (top < 0) top = 0;
    if (right >= term->cols) right = term->cols-1;
    if (bottom >= term->rows) bottom = term->rows-1;

    for (i = top; i <= bottom && i < term->rows; i++) {
        if ((term->disptext[i]->lattr & LATTR_MODE) == LATTR_NORM)
            for (j = left; j <= right && j < term->cols; j++)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
        else
            for (j = left / 2; j <= right / 2 + 1 && j < term->cols; j++)
                term->disptext[i]->chars[j].attr |= ATTR_INVALID;
    }

    if (immediately) {
        do_paint(term);
    } else {
        term_schedule_update(term);
    }
}